

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_formatter.h
# Opt level: O0

void ST::apply_format<int,double,char_const(&)[4]>
               (format_writer *data,int *arg0,double *args,char (*args_1) [4])

{
  bool bVar1;
  out_of_range *this;
  char *value;
  function<void_(const_ST::format_spec_&,_ST::format_writer_&)> *local_e0;
  ulong local_d0;
  size_t formatter_id;
  format_spec spec;
  ulong local_90;
  size_t index;
  formatter_ref_t formatters [3];
  char (*args_local_1) [4];
  double *args_local;
  int *arg0_local;
  format_writer *data_local;
  
  formatters[2]._M_invoker = (_Invoker_type)args_1;
  make_formatter_ref<int>((formatter_ref_t *)&index,*arg0);
  make_formatter_ref<double>((formatter_ref_t *)&formatters[0]._M_invoker,*args);
  make_formatter_ref<char_const*>
            ((formatter_ref_t *)&formatters[1]._M_invoker,(ST *)formatters[2]._M_invoker,value);
  local_90 = 0;
  while( true ) {
    bVar1 = format_writer::next_format(data);
    if (!bVar1) {
      local_e0 = (function<void_(const_ST::format_spec_&,_ST::format_writer_&)> *)
                 &formatters[2]._M_invoker;
      do {
        local_e0 = local_e0 + -1;
        std::function<void_(const_ST::format_spec_&,_ST::format_writer_&)>::~function(local_e0);
      } while (local_e0 != (function<void_(const_ST::format_spec_&,_ST::format_writer_&)> *)&index);
      return;
    }
    format_writer::parse_format((format_spec *)&formatter_id,data);
    if (spec.minimum_length < 0) {
      local_d0 = local_90;
      local_90 = local_90 + 1;
    }
    else {
      local_d0 = (ulong)(spec.minimum_length + -1);
    }
    if (2 < local_d0) break;
    std::function<void_(const_ST::format_spec_&,_ST::format_writer_&)>::operator()
              ((function<void_(const_ST::format_spec_&,_ST::format_writer_&)> *)
               &formatters[local_d0 - 1]._M_invoker,(format_spec *)&formatter_id,data);
  }
  this = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this,"Parameter index out of range");
  __cxa_throw(this,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

void apply_format(ST::format_writer &data, arg0_T &&arg0, args_T &&...args)
    {
        enum { num_formatters = 1 + sizeof...(args) };
        formatter_ref_t formatters[num_formatters] = {
            make_formatter_ref(std::forward<arg0_T>(arg0)),
            make_formatter_ref(std::forward<args_T>(args))...
        };
        size_t index = 0;
        while (data.next_format()) {
            ST::format_spec spec = data.parse_format();
            size_t formatter_id = (spec.arg_index >= 0)
                                  ? spec.arg_index - 1
                                  : index++;
            if (formatter_id >= num_formatters)
                throw std::out_of_range("Parameter index out of range");
            formatters[formatter_id](spec, data);
        }
    }